

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::SubMessagePrefix
          (string *__return_storage_ptr__,internal *this,string *prefix,FieldDescriptor *field,
          int index)

{
  char *pcVar1;
  string *psVar2;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  long local_50;
  char local_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&prefix->_M_dataplus);
  if (((byte)field[1] & 8) == 0) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,**(ulong **)(field + 8));
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,*(ulong *)(*(long *)(field + 8) + 0x20));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (index != -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_58 = local_48;
    pcVar1 = FastInt32ToBufferLeft(index,local_48);
    local_50 = (long)pcVar1 - (long)local_48;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,local_58,local_58 + local_50)
    ;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(StrCat(index));
    result.append("]");
  }
  result.append(".");
  return result;
}